

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O0

void __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
          (cache<uint256,_SignatureCacheHasher> *this,uint256 e)

{
  long lVar1;
  bool bVar2;
  iterator pvVar3;
  reference pvVar4;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  bool epoch;
  uint32_t loc_1;
  iterator __end3;
  iterator __begin3;
  array<unsigned_int,_8UL> *__range3;
  uint8_t depth;
  uint32_t loc;
  iterator __end2;
  iterator __begin2;
  array<unsigned_int,_8UL> *__range2;
  bool last_epoch;
  uint32_t last_loc;
  array<unsigned_int,_8UL> locs;
  cache<uint256,_SignatureCacheHasher> *in_stack_fffffffffffffef8;
  base_blob<256U> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0c;
  undefined1 in_stack_ffffffffffffff0d;
  undefined1 in_stack_ffffffffffffff0e;
  undefined1 in_stack_ffffffffffffff0f;
  cache<uint256,_SignatureCacheHasher> *this_00;
  undefined4 in_stack_ffffffffffffff20;
  value_type_conflict2 in_stack_ffffffffffffff24;
  iterator local_d0;
  byte local_bd;
  iterator local_b0;
  bool local_99;
  
  this_00 = (cache<uint256,_SignatureCacheHasher> *)&stack0x00000008;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  epoch_check(this_00);
  invalid(in_stack_fffffffffffffef8);
  local_99 = true;
  compute_hashes(this_00,in_RDI);
  local_b0 = std::array<unsigned_int,_8UL>::begin
                       ((array<unsigned_int,_8UL> *)in_stack_fffffffffffffef8);
  pvVar3 = std::array<unsigned_int,_8UL>::end((array<unsigned_int,_8UL> *)in_stack_fffffffffffffef8)
  ;
  do {
    if (local_b0 == pvVar3) {
      for (local_bd = 0; local_bd < in_RDI[2].super_base_blob<256U>.m_data._M_elems[0x18];
          local_bd = local_bd + 1) {
        local_d0 = std::array<unsigned_int,_8UL>::begin
                             ((array<unsigned_int,_8UL> *)in_stack_fffffffffffffef8);
        pvVar3 = std::array<unsigned_int,_8UL>::end
                           ((array<unsigned_int,_8UL> *)in_stack_fffffffffffffef8);
        for (; local_d0 != pvVar3; local_d0 = local_d0 + 1) {
          in_stack_ffffffffffffff24 = *local_d0;
          bVar2 = bit_packed_atomic_flags::bit_is_set
                            ((bit_packed_atomic_flags *)in_RDI,
                             CONCAT13(in_stack_ffffffffffffff0f,
                                      CONCAT12(in_stack_ffffffffffffff0e,
                                               CONCAT11(in_stack_ffffffffffffff0d,
                                                        in_stack_ffffffffffffff0c))));
          if (bVar2) {
            pvVar4 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                               ((vector<uint256,_std::allocator<uint256>_> *)
                                CONCAT17(in_stack_ffffffffffffff0f,
                                         CONCAT16(in_stack_ffffffffffffff0e,
                                                  CONCAT15(in_stack_ffffffffffffff0d,
                                                           CONCAT14(in_stack_ffffffffffffff0c,
                                                                    in_stack_ffffffffffffff08)))),
                                (size_type)in_stack_ffffffffffffff00);
            *(pointer *)(pvVar4->super_base_blob<256U>).m_data._M_elems =
                 (this_00->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start;
            *(pointer *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 8) =
                 (this_00->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            *(pointer *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x10) =
                 (this_00->table).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            *(undefined8 *)((pvVar4->super_base_blob<256U>).m_data._M_elems + 0x18) =
                 *(undefined8 *)&this_00->size;
            please_keep(in_stack_fffffffffffffef8,0);
            std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT17(in_stack_ffffffffffffff0f,
                                CONCAT16(local_99,CONCAT15(in_stack_ffffffffffffff0d,
                                                           CONCAT14(in_stack_ffffffffffffff0c,
                                                                    in_stack_ffffffffffffff08)))),
                       (size_type)in_stack_ffffffffffffff00);
            std::_Bit_reference::operator=
                      ((_Bit_reference *)
                       CONCAT17(in_stack_ffffffffffffff0f,
                                CONCAT16(local_99,CONCAT15(in_stack_ffffffffffffff0d,
                                                           CONCAT14(in_stack_ffffffffffffff0c,
                                                                    in_stack_ffffffffffffff08)))),
                       SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
            goto LAB_0080af54;
          }
        }
        in_stack_fffffffffffffef8 =
             (cache<uint256,_SignatureCacheHasher> *)
             std::array<unsigned_int,_8UL>::begin
                       ((array<unsigned_int,_8UL> *)in_stack_fffffffffffffef8);
        std::array<unsigned_int,_8UL>::end((array<unsigned_int,_8UL> *)in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff00 =
             (base_blob<256U> *)
             std::find<unsigned_int*,unsigned_int>
                       (pvVar3,(uint *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)
                        ,(uint *)this_00);
        std::array<unsigned_int,_8UL>::begin((array<unsigned_int,_8UL> *)in_stack_fffffffffffffef8);
        std::array<unsigned_int,_8UL>::operator[]
                  ((array<unsigned_int,_8UL> *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,
                                     CONCAT15(in_stack_ffffffffffffff0d,
                                              CONCAT14(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08)))),
                   (size_type)in_stack_ffffffffffffff00);
        std::vector<uint256,_std::allocator<uint256>_>::operator[]
                  ((vector<uint256,_std::allocator<uint256>_> *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,
                                     CONCAT15(in_stack_ffffffffffffff0d,
                                              CONCAT14(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08)))),
                   (size_type)in_stack_ffffffffffffff00);
        std::swap<uint256>((uint256 *)in_stack_fffffffffffffef8,(uint256 *)0x80ae68);
        in_stack_ffffffffffffff20 = CONCAT13(local_99,(int3)in_stack_ffffffffffffff20);
        std::vector<bool,_std::allocator<bool>_>::operator[]
                  ((vector<bool,_std::allocator<bool>_> *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,
                                     CONCAT15(in_stack_ffffffffffffff0d,
                                              CONCAT14(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08)))),
                   (size_type)in_stack_ffffffffffffff00);
        local_99 = std::_Bit_reference::operator_cast_to_bool
                             ((_Bit_reference *)in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff0d = (undefined1)((uint)in_stack_ffffffffffffff20 >> 0x18);
        std::vector<bool,_std::allocator<bool>_>::operator[]
                  ((vector<bool,_std::allocator<bool>_> *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,
                                     CONCAT15(in_stack_ffffffffffffff0d,
                                              CONCAT14(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08)))),
                   (size_type)in_stack_ffffffffffffff00);
        std::_Bit_reference::operator=
                  ((_Bit_reference *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,
                                     CONCAT15(in_stack_ffffffffffffff0d,
                                              CONCAT14(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08)))),
                   SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
        compute_hashes(this_00,in_RDI);
      }
LAB_0080af54:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    std::vector<uint256,_std::allocator<uint256>_>::operator[]
              ((vector<uint256,_std::allocator<uint256>_> *)
               CONCAT17(in_stack_ffffffffffffff0f,
                        CONCAT16(in_stack_ffffffffffffff0e,
                                 CONCAT15(in_stack_ffffffffffffff0d,
                                          CONCAT14(in_stack_ffffffffffffff0c,
                                                   in_stack_ffffffffffffff08)))),
               (size_type)in_stack_ffffffffffffff00);
    bVar2 = ::operator==((base_blob<256U> *)
                         CONCAT17(in_stack_ffffffffffffff0f,
                                  CONCAT16(in_stack_ffffffffffffff0e,
                                           CONCAT15(in_stack_ffffffffffffff0d,
                                                    CONCAT14(in_stack_ffffffffffffff0c,
                                                             in_stack_ffffffffffffff08)))),
                         in_stack_ffffffffffffff00);
    if (bVar2) {
      please_keep(in_stack_fffffffffffffef8,0);
      std::vector<bool,_std::allocator<bool>_>::operator[]
                ((vector<bool,_std::allocator<bool>_> *)
                 CONCAT17(1,CONCAT16(in_stack_ffffffffffffff0e,
                                     CONCAT15(in_stack_ffffffffffffff0d,
                                              CONCAT14(in_stack_ffffffffffffff0c,
                                                       in_stack_ffffffffffffff08)))),
                 (size_type)in_stack_ffffffffffffff00);
      std::_Bit_reference::operator=
                ((_Bit_reference *)
                 CONCAT17(local_99,CONCAT16(in_stack_ffffffffffffff0e,
                                            CONCAT15(in_stack_ffffffffffffff0d,
                                                     CONCAT14(in_stack_ffffffffffffff0c,
                                                              in_stack_ffffffffffffff08)))),
                 SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
      goto LAB_0080af54;
    }
    local_b0 = local_b0 + 1;
  } while( true );
}

Assistant:

inline void insert(Element e)
    {
        epoch_check();
        uint32_t last_loc = invalid();
        bool last_epoch = true;
        std::array<uint32_t, 8> locs = compute_hashes(e);
        // Make sure we have not already inserted this element
        // If we have, make sure that it does not get deleted
        for (const uint32_t loc : locs)
            if (table[loc] == e) {
                please_keep(loc);
                epoch_flags[loc] = last_epoch;
                return;
            }
        for (uint8_t depth = 0; depth < depth_limit; ++depth) {
            // First try to insert to an empty slot, if one exists
            for (const uint32_t loc : locs) {
                if (!collection_flags.bit_is_set(loc))
                    continue;
                table[loc] = std::move(e);
                please_keep(loc);
                epoch_flags[loc] = last_epoch;
                return;
            }
            /** Swap with the element at the location that was
            * not the last one looked at. Example:
            *
            * 1. On first iteration, last_loc == invalid(), find returns last, so
            *    last_loc defaults to locs[0].
            * 2. On further iterations, where last_loc == locs[k], last_loc will
            *    go to locs[k+1 % 8], i.e., next of the 8 indices wrapping around
            *    to 0 if needed.
            *
            * This prevents moving the element we just put in.
            *
            * The swap is not a move -- we must switch onto the evicted element
            * for the next iteration.
            */
            last_loc = locs[(1 + (std::find(locs.begin(), locs.end(), last_loc) - locs.begin())) & 7];
            std::swap(table[last_loc], e);
            // Can't std::swap a std::vector<bool>::reference and a bool&.
            bool epoch = last_epoch;
            last_epoch = epoch_flags[last_loc];
            epoch_flags[last_loc] = epoch;

            // Recompute the locs -- unfortunately happens one too many times!
            locs = compute_hashes(e);
        }
    }